

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O0

int __thiscall
booster::aio::epoll_reactor::poll(epoll_reactor *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *in_R8;
  int i;
  int read;
  int size;
  epoll_event fds [128];
  int local_634;
  int local_630;
  epoll_event local_628 [96];
  int *local_28;
  int local_20;
  int local_1c;
  pollfd *local_18;
  epoll_reactor *local_10;
  int local_4;
  
  local_1c = (int)__nfds;
  local_28 = in_R8;
  local_20 = __timeout;
  local_18 = __fds;
  local_10 = this;
  memset(local_628,0,0x600);
  if (0x80 < local_1c) {
    local_1c = 0x80;
  }
  iVar1 = epoll_wait(this->pollfd_,local_628,local_1c,local_20);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    *local_28 = *piVar3;
    local_4 = -1;
  }
  else {
    local_630 = 0;
    for (local_634 = 0; local_634 < iVar1; local_634 = local_634 + 1) {
      iVar2 = to_user_events(this,(&local_628[0].events)[(long)local_634 * 3]);
      local_18[local_630].events = (short)iVar2;
      local_18[local_630].revents = (short)((uint)iVar2 >> 0x10);
      local_18[local_630].fd = *(int *)(&local_628[0].field_0x4 + (long)local_634 * 0xc);
      local_630 = local_630 + 1;
    }
    local_4 = local_630;
  }
  return local_4;
}

Assistant:

virtual int poll(reactor::event *events,int n,int timeout,int &error)
		{
			struct epoll_event fds[128] = {};
			if (n >128) n=128;

			int size = 0;
			size = ::epoll_wait(pollfd_,fds,n,timeout);
			
			if(size < 0) {
				error = errno;
				return -1;
			}
			int read = 0;
			for(int i=0;i<size;i++) {
				events[read].events = to_user_events(fds[i].events);
				events[read].fd = fds[i].data.fd; 
				read ++;
			}
			return read;
		}